

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_1da1d1::Db::parseType(Db *this)

{
  char cVar1;
  bool bVar2;
  Node *local_90;
  Node *TA_1;
  Node *Sub;
  Node *P_1;
  Node *P;
  Node *local_68;
  Node *Ref_1;
  Node *local_58;
  Node *Ref;
  Node *Ptr;
  Node *TA;
  Node *Child;
  StringView Res;
  Db *pDStack_20;
  uint AfterQuals;
  Node *Result;
  Db *this_local;
  
  pDStack_20 = (Db *)0x0;
  Result = (Node *)this;
  if (this->TypeCallback != (_func_void_void_ptr_char_ptr *)0x0) {
    (*this->TypeCallback)(this->TypeCallbackContext,this->First);
  }
  cVar1 = look(this,0);
  switch(cVar1) {
  case 'A':
    pDStack_20 = (Db *)parseArrayType(this);
    goto LAB_002578e5;
  default:
switchD_00256ea1_caseD_42:
    pDStack_20 = (Db *)parseClassEnumType(this);
    goto LAB_002578e5;
  case 'C':
    this->First = this->First + 1;
    P_1 = parseType(this);
    if (P_1 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pDStack_20 = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::PostfixQualifiedType,(anonymous_namespace)::Node*&,char_const(&)[9]>
                                 ((Db *)this,&P_1,(char (*) [9])" complex");
    goto LAB_002578e5;
  case 'D':
    cVar1 = look(this,1);
    switch(cVar1) {
    case 'O':
    case 'o':
    case 'w':
    case 'x':
      pDStack_20 = (Db *)parseFunctionType(this);
    default:
      goto switchD_0025737b_caseD_50;
    case 'T':
    case 't':
      pDStack_20 = (Db *)parseDecltype(this);
      goto switchD_0025737b_caseD_50;
    case 'a':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[5]>
                                   ((Db *)this,(char (*) [5])"auto");
      break;
    case 'c':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[15]>
                                   ((Db *)this,(char (*) [15])"decltype(auto)");
      break;
    case 'd':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"decimal64");
      break;
    case 'e':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"decimal128");
      break;
    case 'f':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"decimal32");
      break;
    case 'h':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"decimal16");
      break;
    case 'i':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[9]>
                                   ((Db *)this,(char (*) [9])"char32_t");
      break;
    case 'n':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[15]>
                                   ((Db *)this,(char (*) [15])"std::nullptr_t");
      break;
    case 'p':
      this->First = this->First + 2;
      TA = parseType(this);
      if (TA == (Node *)0x0) {
        return (Node *)0x0;
      }
      pDStack_20 = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::ParameterPackExpansion,(anonymous_namespace)::Node*&>
                                   ((Db *)this,&TA);
      goto switchD_0025737b_caseD_50;
    case 's':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[9]>
                                   ((Db *)this,(char (*) [9])"char16_t");
      break;
    case 'v':
      pDStack_20 = (Db *)parseVectorType(this);
switchD_0025737b_caseD_50:
      goto LAB_002578e5;
    }
    break;
  case 'F':
    pDStack_20 = (Db *)parseFunctionType(this);
    goto LAB_002578e5;
  case 'G':
    this->First = this->First + 1;
    Sub = parseType(this);
    if (Sub == (Node *)0x0) {
      return (Node *)0x0;
    }
    pDStack_20 = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::PostfixQualifiedType,(anonymous_namespace)::Node*&,char_const(&)[11]>
                                 ((Db *)this,&Sub,(char (*) [11])" imaginary");
    goto LAB_002578e5;
  case 'K':
  case 'V':
  case 'r':
    Res.Last._4_4_ = 0;
    cVar1 = look(this,0);
    if (cVar1 == 'r') {
      Res.Last._4_4_ = Res.Last._4_4_ + 1;
    }
    cVar1 = look(this,Res.Last._4_4_);
    if (cVar1 == 'V') {
      Res.Last._4_4_ = Res.Last._4_4_ + 1;
    }
    cVar1 = look(this,Res.Last._4_4_);
    if (cVar1 == 'K') {
      Res.Last._4_4_ = Res.Last._4_4_ + 1;
    }
    cVar1 = look(this,Res.Last._4_4_);
    if ((cVar1 != 'F') &&
       ((cVar1 = look(this,Res.Last._4_4_), cVar1 != 'D' ||
        ((((cVar1 = look(this,Res.Last._4_4_ + 1), cVar1 != 'o' &&
           (cVar1 = look(this,Res.Last._4_4_ + 1), cVar1 != 'O')) &&
          (cVar1 = look(this,Res.Last._4_4_ + 1), cVar1 != 'w')) &&
         (cVar1 = look(this,Res.Last._4_4_ + 1), cVar1 != 'x')))))) goto switchD_00256ea1_caseD_55;
    pDStack_20 = (Db *)parseFunctionType(this);
    goto LAB_002578e5;
  case 'M':
    pDStack_20 = (Db *)parsePointerToMemberType(this);
    goto LAB_002578e5;
  case 'O':
    this->First = this->First + 1;
    local_68 = parseType(this);
    if (local_68 == (Node *)0x0) {
      return (Node *)0x0;
    }
    P._4_4_ = 1;
    pDStack_20 = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::ReferenceType,(anonymous_namespace)::Node*&,(anonymous_namespace)::ReferenceKind>
                                 ((Db *)this,&local_68,(ReferenceKind *)((long)&P + 4));
    goto LAB_002578e5;
  case 'P':
    this->First = this->First + 1;
    Ref = parseType(this);
    if (Ref == (Node *)0x0) {
      return (Node *)0x0;
    }
    pDStack_20 = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::PointerType,(anonymous_namespace)::Node*&>
                                 ((Db *)this,&Ref);
    goto LAB_002578e5;
  case 'R':
    this->First = this->First + 1;
    local_58 = parseType(this);
    if (local_58 == (Node *)0x0) {
      return (Node *)0x0;
    }
    Ref_1._4_4_ = 0;
    pDStack_20 = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::ReferenceType,(anonymous_namespace)::Node*&,(anonymous_namespace)::ReferenceKind>
                                 ((Db *)this,&local_58,(ReferenceKind *)((long)&Ref_1 + 4));
    goto LAB_002578e5;
  case 'S':
    cVar1 = look(this,1);
    if ((cVar1 == '\0') || (cVar1 = look(this,1), cVar1 == 't')) goto switchD_00256ea1_caseD_42;
    TA_1 = parseSubstitution(this);
    if (TA_1 == (Node *)0x0) {
      return (Node *)0x0;
    }
    if (((this->TryToParseTemplateArgs & 1U) == 0) || (cVar1 = look(this,0), cVar1 != 'I')) {
      return TA_1;
    }
    local_90 = parseTemplateArgs(this,false);
    if (local_90 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pDStack_20 = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                                 ((Db *)this,&TA_1,&local_90);
    goto LAB_002578e5;
  case 'T':
    cVar1 = look(this,1);
    if (((cVar1 == 's') || (cVar1 = look(this,1), cVar1 == 'u')) ||
       (cVar1 = look(this,1), cVar1 == 'e')) {
      pDStack_20 = (Db *)parseClassEnumType(this);
    }
    else {
      pDStack_20 = (Db *)parseTemplateParam(this);
      if (pDStack_20 == (Db *)0x0) {
        return (Node *)0x0;
      }
      if (((this->TryToParseTemplateArgs & 1U) != 0) && (cVar1 = look(this,0), cVar1 == 'I')) {
        Ptr = parseTemplateArgs(this,false);
        if (Ptr == (Node *)0x0) {
          return (Node *)0x0;
        }
        pDStack_20 = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                                     ((Db *)this,(Node **)&stack0xffffffffffffffe0,&Ptr);
      }
    }
    goto LAB_002578e5;
  case 'U':
switchD_00256ea1_caseD_55:
    pDStack_20 = (Db *)parseQualifiedType(this);
LAB_002578e5:
    if (pDStack_20 != (Db *)0x0) {
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                (&this->Subs,(Node **)&stack0xffffffffffffffe0);
    }
    this_local = pDStack_20;
    break;
  case 'a':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[12]>
                                 ((Db *)this,(char (*) [12])0x2856c3);
    break;
  case 'b':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[5]>
                                 ((Db *)this,(char (*) [5])"bool");
    break;
  case 'c':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[5]>
                                 ((Db *)this,(char (*) [5])0x2856ca);
    break;
  case 'd':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[7]>
                                 ((Db *)this,(char (*) [7])0x285fc8);
    break;
  case 'e':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[12]>
                                 ((Db *)this,(char (*) [12])"long double");
    break;
  case 'f':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[6]>
                                 ((Db *)this,(char (*) [6])"float");
    break;
  case 'g':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                 ((Db *)this,(char (*) [11])"__float128");
    break;
  case 'h':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[14]>
                                 ((Db *)this,(char (*) [14])"unsigned char");
    break;
  case 'i':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[4]>
                                 ((Db *)this,(char (*) [4])0x285f98);
    break;
  case 'j':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[13]>
                                 ((Db *)this,(char (*) [13])"unsigned int");
    break;
  case 'l':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[5]>
                                 ((Db *)this,(char (*) [5])0x285fa5);
    break;
  case 'm':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[14]>
                                 ((Db *)this,(char (*) [14])"unsigned long");
    break;
  case 'n':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[9]>
                                 ((Db *)this,(char (*) [9])0x2856e7);
    break;
  case 'o':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[18]>
                                 ((Db *)this,(char (*) [18])"unsigned __int128");
    break;
  case 's':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[6]>
                                 ((Db *)this,(char (*) [6])0x2856d8);
    break;
  case 't':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[15]>
                                 ((Db *)this,(char (*) [15])"unsigned short");
    break;
  case 'u':
    this->First = this->First + 1;
    _Child = parseBareSourceName(this);
    bVar2 = StringView::empty((StringView *)&Child);
    if (bVar2) {
      this_local = (Db *)0x0;
    }
    else {
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,StringView&>
                                   ((Db *)this,(StringView *)&Child);
    }
    break;
  case 'v':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[5]>
                                 ((Db *)this,(char (*) [5])"void");
    break;
  case 'w':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[8]>
                                 ((Db *)this,(char (*) [8])"wchar_t");
    break;
  case 'x':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                 ((Db *)this,(char (*) [10])0x285fb3);
    break;
  case 'y':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[19]>
                                 ((Db *)this,(char (*) [19])"unsigned long long");
    break;
  case 'z':
    this->First = this->First + 1;
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::NameType,char_const(&)[4]>
                                 ((Db *)this,(char (*) [4])0x2703be);
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseType() {
  Node *Result = nullptr;

  if (TypeCallback != nullptr)
    TypeCallback(TypeCallbackContext, First);

  switch (look()) {
  //             ::= <qualified-type>
  case 'r':
  case 'V':
  case 'K': {
    unsigned AfterQuals = 0;
    if (look(AfterQuals) == 'r') ++AfterQuals;
    if (look(AfterQuals) == 'V') ++AfterQuals;
    if (look(AfterQuals) == 'K') ++AfterQuals;

    if (look(AfterQuals) == 'F' ||
        (look(AfterQuals) == 'D' &&
         (look(AfterQuals + 1) == 'o' || look(AfterQuals + 1) == 'O' ||
          look(AfterQuals + 1) == 'w' || look(AfterQuals + 1) == 'x'))) {
      Result = parseFunctionType();
      break;
    }
    LLVM_FALLTHROUGH;
  }
  case 'U': {
    Result = parseQualifiedType();
    break;
  }
  // <builtin-type> ::= v    # void
  case 'v':
    ++First;
    return make<NameType>("void");
  //                ::= w    # wchar_t
  case 'w':
    ++First;
    return make<NameType>("wchar_t");
  //                ::= b    # bool
  case 'b':
    ++First;
    return make<NameType>("bool");
  //                ::= c    # char
  case 'c':
    ++First;
    return make<NameType>("char");
  //                ::= a    # signed char
  case 'a':
    ++First;
    return make<NameType>("signed char");
  //                ::= h    # unsigned char
  case 'h':
    ++First;
    return make<NameType>("unsigned char");
  //                ::= s    # short
  case 's':
    ++First;
    return make<NameType>("short");
  //                ::= t    # unsigned short
  case 't':
    ++First;
    return make<NameType>("unsigned short");
  //                ::= i    # int
  case 'i':
    ++First;
    return make<NameType>("int");
  //                ::= j    # unsigned int
  case 'j':
    ++First;
    return make<NameType>("unsigned int");
  //                ::= l    # long
  case 'l':
    ++First;
    return make<NameType>("long");
  //                ::= m    # unsigned long
  case 'm':
    ++First;
    return make<NameType>("unsigned long");
  //                ::= x    # long long, __int64
  case 'x':
    ++First;
    return make<NameType>("long long");
  //                ::= y    # unsigned long long, __int64
  case 'y':
    ++First;
    return make<NameType>("unsigned long long");
  //                ::= n    # __int128
  case 'n':
    ++First;
    return make<NameType>("__int128");
  //                ::= o    # unsigned __int128
  case 'o':
    ++First;
    return make<NameType>("unsigned __int128");
  //                ::= f    # float
  case 'f':
    ++First;
    return make<NameType>("float");
  //                ::= d    # double
  case 'd':
    ++First;
    return make<NameType>("double");
  //                ::= e    # long double, __float80
  case 'e':
    ++First;
    return make<NameType>("long double");
  //                ::= g    # __float128
  case 'g':
    ++First;
    return make<NameType>("__float128");
  //                ::= z    # ellipsis
  case 'z':
    ++First;
    return make<NameType>("...");

  // <builtin-type> ::= u <source-name>    # vendor extended type
  case 'u': {
    ++First;
    StringView Res = parseBareSourceName();
    if (Res.empty())
      return nullptr;
    return make<NameType>(Res);
  }
  case 'D':
    switch (look(1)) {
    //                ::= Dd   # IEEE 754r decimal floating point (64 bits)
    case 'd':
      First += 2;
      return make<NameType>("decimal64");
    //                ::= De   # IEEE 754r decimal floating point (128 bits)
    case 'e':
      First += 2;
      return make<NameType>("decimal128");
    //                ::= Df   # IEEE 754r decimal floating point (32 bits)
    case 'f':
      First += 2;
      return make<NameType>("decimal32");
    //                ::= Dh   # IEEE 754r half-precision floating point (16 bits)
    case 'h':
      First += 2;
      return make<NameType>("decimal16");
    //                ::= Di   # char32_t
    case 'i':
      First += 2;
      return make<NameType>("char32_t");
    //                ::= Ds   # char16_t
    case 's':
      First += 2;
      return make<NameType>("char16_t");
    //                ::= Da   # auto (in dependent new-expressions)
    case 'a':
      First += 2;
      return make<NameType>("auto");
    //                ::= Dc   # decltype(auto)
    case 'c':
      First += 2;
      return make<NameType>("decltype(auto)");
    //                ::= Dn   # std::nullptr_t (i.e., decltype(nullptr))
    case 'n':
      First += 2;
      return make<NameType>("std::nullptr_t");

    //             ::= <decltype>
    case 't':
    case 'T': {
      Result = parseDecltype();
      break;
    }
    // extension   ::= <vector-type> # <vector-type> starts with Dv
    case 'v': {
      Result = parseVectorType();
      break;
    }
    //           ::= Dp <type>       # pack expansion (C++0x)
    case 'p': {
      First += 2;
      Node *Child = parseType();
      if (!Child)
        return nullptr;
      Result = make<ParameterPackExpansion>(Child);
      break;
    }
    // Exception specifier on a function type.
    case 'o':
    case 'O':
    case 'w':
    // Transaction safe function type.
    case 'x':
      Result = parseFunctionType();
      break;
    }
    break;
  //             ::= <function-type>
  case 'F': {
    Result = parseFunctionType();
    break;
  }
  //             ::= <array-type>
  case 'A': {
    Result = parseArrayType();
    break;
  }
  //             ::= <pointer-to-member-type>
  case 'M': {
    Result = parsePointerToMemberType();
    break;
  }
  //             ::= <template-param>
  case 'T': {
    // This could be an elaborate type specifier on a <class-enum-type>.
    if (look(1) == 's' || look(1) == 'u' || look(1) == 'e') {
      Result = parseClassEnumType();
      break;
    }

    Result = parseTemplateParam();
    if (Result == nullptr)
      return nullptr;

    // Result could be either of:
    //   <type>        ::= <template-param>
    //   <type>        ::= <template-template-param> <template-args>
    //
    //   <template-template-param> ::= <template-param>
    //                             ::= <substitution>
    //
    // If this is followed by some <template-args>, and we're permitted to
    // parse them, take the second production.

    if (TryToParseTemplateArgs && look() == 'I') {
      Node *TA = parseTemplateArgs();
      if (TA == nullptr)
        return nullptr;
      Result = make<NameWithTemplateArgs>(Result, TA);
    }
    break;
  }
  //             ::= P <type>        # pointer
  case 'P': {
    ++First;
    Node *Ptr = parseType();
    if (Ptr == nullptr)
      return nullptr;
    Result = make<PointerType>(Ptr);
    break;
  }
  //             ::= R <type>        # l-value reference
  case 'R': {
    ++First;
    Node *Ref = parseType();
    if (Ref == nullptr)
      return nullptr;
    Result = make<ReferenceType>(Ref, ReferenceKind::LValue);
    break;
  }
  //             ::= O <type>        # r-value reference (C++11)
  case 'O': {
    ++First;
    Node *Ref = parseType();
    if (Ref == nullptr)
      return nullptr;
    Result = make<ReferenceType>(Ref, ReferenceKind::RValue);
    break;
  }
  //             ::= C <type>        # complex pair (C99)
  case 'C': {
    ++First;
    Node *P = parseType();
    if (P == nullptr)
      return nullptr;
    Result = make<PostfixQualifiedType>(P, " complex");
    break;
  }
  //             ::= G <type>        # imaginary (C99)
  case 'G': {
    ++First;
    Node *P = parseType();
    if (P == nullptr)
      return P;
    Result = make<PostfixQualifiedType>(P, " imaginary");
    break;
  }
  //             ::= <substitution>  # See Compression below
  case 'S': {
    if (look(1) && look(1) != 't') {
      Node *Sub = parseSubstitution();
      if (Sub == nullptr)
        return nullptr;

      // Sub could be either of:
      //   <type>        ::= <substitution>
      //   <type>        ::= <template-template-param> <template-args>
      //
      //   <template-template-param> ::= <template-param>
      //                             ::= <substitution>
      //
      // If this is followed by some <template-args>, and we're permitted to
      // parse them, take the second production.

      if (TryToParseTemplateArgs && look() == 'I') {
        Node *TA = parseTemplateArgs();
        if (TA == nullptr)
          return nullptr;
        Result = make<NameWithTemplateArgs>(Sub, TA);
        break;
      }

      // If all we parsed was a substitution, don't re-insert into the
      // substitution table.
      return Sub;
    }
    LLVM_FALLTHROUGH;
  }
  //        ::= <class-enum-type>
  default: {
    Result = parseClassEnumType();
    break;
  }
  }

  // If we parsed a type, insert it into the substitution table. Note that all
  // <builtin-type>s and <substitution>s have already bailed out, because they
  // don't get substitutions.
  if (Result != nullptr)
    Subs.push_back(Result);
  return Result;
}